

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O1

size_t ZSTD_ldm_generateSequences
                 (ldmState_t *ldmState,rawSeqStore_t *sequences,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  BYTE **ppBVar1;
  U32 *pUVar2;
  size_t sVar3;
  rawSeq *prVar4;
  bool bVar5;
  U32 UVar6;
  ulong uVar7;
  XXH64_hash_t XVar8;
  ulong uVar9;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  ulong *puVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  ulong *puVar18;
  BYTE *pBVar19;
  ldmEntry_t *plVar20;
  ulong *puVar21;
  ulong *puVar22;
  ulong uVar23;
  BYTE *data;
  U32 UVar24;
  ulong uVar25;
  ulong uVar26;
  ulong *puVar27;
  ulong *puVar28;
  U32 u;
  uint uVar29;
  ulong *puVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  ulong *puVar37;
  ldmEntry_t **pplVar38;
  uint uVar39;
  ldmRollingHashState_t hashState;
  uint local_1d4;
  ulong local_1d0;
  ulong *local_1c8;
  ulong *local_1c0;
  BYTE *local_1b8;
  ldmMatchCandidate_t *local_1b0;
  ulong *local_1a8;
  ulong local_1a0;
  ulong local_198;
  uint local_190;
  uint local_18c;
  ulong local_188;
  ldmParams_t *local_180;
  ldmState_t *local_178;
  BYTE *local_170;
  ulong *local_168;
  ulong local_160;
  rawSeqStore_t *local_158;
  size_t local_150;
  ulong *local_148;
  ldmEntry_t *local_140;
  ulong *local_138;
  uint local_12c;
  long local_128;
  ulong local_120;
  size_t local_118;
  ulong local_110;
  ulong *local_108;
  ulong *local_100;
  ulong local_f8;
  ulong *local_f0;
  ulong *local_e8;
  ulong *local_e0;
  ldmEntry_t *local_d8;
  size_t local_d0;
  ulong *local_c8;
  void *local_c0;
  ulong local_b8;
  long local_b0;
  ldmEntry_t **local_a8;
  long local_a0;
  size_t *local_98;
  BYTE *local_90;
  long local_88;
  ulong *local_80;
  ulong *local_78;
  BYTE *local_70;
  long local_68;
  ulong local_60;
  ulong *local_58;
  BYTE *local_50;
  BYTE *local_48;
  ldmRollingHashState_t local_40;
  
  uVar39 = 1 << ((byte)params->windowLog & 0x1f);
  uVar7 = (ulong)uVar39;
  local_c8 = (ulong *)((long)src + srcSize);
  lVar35 = ((srcSize >> 0x14) + 1) - (ulong)((srcSize & 0xfffff) == 0);
  local_c0 = src;
  if ((ldmState->window).nextSrc < local_c8) {
    __assert_fail("ldmState->window.nextSrc >= (BYTE const*)src + srcSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                  ,0x209,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  if (sequences->size < sequences->pos) {
    __assert_fail("sequences->pos <= sequences->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                  ,0x20d,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  if (sequences->capacity < sequences->size) {
    __assert_fail("sequences->size <= sequences->capacity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                  ,0x20e,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  if (lVar35 != 0) {
    uVar39 = uVar39 + 2;
    local_98 = ldmState->splitIndices;
    local_1b0 = ldmState->matchCandidates;
    local_a8 = &ldmState->matchCandidates[0].bucket;
    local_b0 = 0;
    local_160 = 0;
    local_180 = params;
    local_178 = ldmState;
    local_158 = sequences;
    local_128 = lVar35;
    local_120 = uVar7;
    local_118 = srcSize;
    do {
      puVar37 = (ulong *)0x0;
      local_b8 = sequences->size;
      if (sequences->capacity <= local_b8) {
        return 0;
      }
      puVar14 = (ulong *)((long)local_c0 + local_b0 * 0x100000);
      puVar30 = puVar14 + 0x20000;
      if (srcSize + local_b0 * -0x100000 < 0x100000) {
        puVar30 = local_c8;
      }
      if ((long)srcSize <= local_b0 * 0x100000) {
        __assert_fail("chunkStart < iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                      ,0x218,
                      "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                     );
      }
      pBVar19 = (ldmState->window).base;
      iVar16 = (int)pBVar19;
      if (0xe0000000 < (uint)((int)puVar30 - iVar16)) {
        UVar6 = params->hashLog;
        uVar12 = (int)puVar14 - iVar16;
        uVar13 = uVar12 - uVar39;
        if (uVar12 < uVar39 || uVar13 == 0) {
          __assert_fail("curr > newCurrent",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x448,
                        "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
        }
        if (uVar13 < 0x10000001) {
          __assert_fail("correction > 1<<28",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,1099,
                        "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
        }
        (ldmState->window).base = pBVar19 + uVar13;
        ppBVar1 = &(ldmState->window).dictBase;
        *ppBVar1 = *ppBVar1 + uVar13;
        uVar12 = (ldmState->window).dictLimit;
        uVar17 = (ldmState->window).lowLimit;
        uVar29 = uVar17 - uVar13;
        if (uVar17 < uVar13 + 2) {
          uVar29 = 2;
        }
        (ldmState->window).lowLimit = uVar29;
        uVar17 = uVar12 - uVar13;
        if (uVar12 < uVar13 + 2) {
          uVar17 = 2;
        }
        (ldmState->window).dictLimit = uVar17;
        if (uVar39 < uVar29) {
          __assert_fail("window->lowLimit <= newCurrent",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x45f,
                        "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
        }
        if (uVar39 < uVar17) {
          __assert_fail("window->dictLimit <= newCurrent",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x460,
                        "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
        }
        pUVar2 = &(ldmState->window).nbOverflowCorrections;
        *pUVar2 = *pUVar2 + 1;
        plVar20 = ldmState->hashTable;
        lVar31 = 0;
        do {
          uVar12 = plVar20[lVar31].offset;
          UVar24 = uVar12 - uVar13;
          if (uVar12 < uVar13) {
            UVar24 = 0;
          }
          plVar20[lVar31].offset = UVar24;
          lVar31 = lVar31 + 1;
        } while (1L << ((byte)UVar6 & 0x3f) != lVar31);
        ldmState->loadedDictEnd = 0;
      }
      local_170 = (ldmState->window).base;
      uVar12 = (int)puVar30 - (int)local_170;
      if (ldmState->loadedDictEnd + (int)uVar7 < uVar12) {
        uVar12 = uVar12 - (int)uVar7;
        if ((ldmState->window).lowLimit < uVar12) {
          (ldmState->window).lowLimit = uVar12;
        }
        uVar12 = (ldmState->window).lowLimit;
        if ((ldmState->window).dictLimit < uVar12) {
          (ldmState->window).dictLimit = uVar12;
        }
        ldmState->loadedDictEnd = 0;
      }
      uVar12 = (ldmState->window).dictLimit;
      local_190 = (ldmState->window).lowLimit;
      local_1c0 = (ulong *)CONCAT44(local_1c0._4_4_,params->hashLog);
      bVar10 = (byte)params->bucketSizeLog;
      local_68 = 1L << (bVar10 & 0x3f);
      uVar13 = params->minMatchLength;
      if (local_190 < uVar12) {
        pBVar19 = (ldmState->window).dictBase;
        local_18c = local_190;
      }
      else {
        pBVar19 = (BYTE *)0x0;
        local_18c = uVar12;
      }
      uVar25 = (long)puVar30 - (long)puVar14;
      local_138 = (ulong *)(pBVar19 + uVar12);
      local_e0 = (ulong *)(pBVar19 + local_18c);
      if (uVar12 <= local_190) {
        local_138 = puVar37;
        local_e0 = puVar37;
      }
      uVar34 = (ulong)uVar13;
      local_110 = uVar25;
      if (uVar34 <= uVar25) {
        if (0x3f < uVar13) {
          uVar13 = 0x40;
        }
        bVar11 = (byte)params->hashRateLog;
        local_40.rolling = 0xffffffff;
        local_40.stopMask = ~(-1L << (bVar11 & 0x3f));
        if (params->hashRateLog - 1 < uVar13) {
          local_40.stopMask = local_40.stopMask << ((char)uVar13 - bVar11 & 0x3f);
        }
        local_168 = (ulong *)(local_170 + uVar12);
        local_58 = (ulong *)((long)puVar14 + uVar25);
        local_90 = (BYTE *)((long)puVar14 + (uVar25 - 8));
        data = (BYTE *)((long)puVar14 + uVar34);
        local_a0 = -uVar34;
        local_12c = ~(-1 << ((char)params->hashLog - bVar10 & 0x1f));
        local_1c0 = (ulong *)((long)local_58 + -7);
        local_e8 = (ulong *)((long)local_58 + -3);
        local_f0 = (ulong *)((long)local_58 + -1);
        local_80 = local_168 + 1;
        local_70 = local_170 + -1;
        local_78 = (ulong *)((long)local_138 + -1);
        local_50 = pBVar19;
        do {
          if (local_90 <= data) {
            uVar25 = (long)puVar30 - (long)puVar14;
            sequences = local_158;
            srcSize = local_118;
            lVar35 = local_128;
            uVar7 = local_120;
            goto LAB_002065cb;
          }
          local_1d4 = 0;
          local_1b8 = data;
          local_150 = ZSTD_ldm_gear_feed(&local_40,data,(long)local_90 - (long)data,local_98,
                                         &local_1d4);
          uVar13 = local_12c;
          uVar7 = (ulong)local_1d4;
          if (local_1d4 != 0) {
            local_1c8 = (ulong *)(local_1b8 + local_a0);
            uVar25 = 0;
            pplVar38 = local_a8;
            local_1a8 = puVar14;
            do {
              pBVar19 = (BYTE *)(local_178->splitIndices[uVar25] + (long)local_1c8);
              XVar8 = ZSTD_XXH64(pBVar19,uVar34,0);
              uVar17 = (uint)XVar8 & uVar13;
              ((ldmMatchCandidate_t *)(pplVar38 + -2))->split = pBVar19;
              *(uint *)(pplVar38 + -1) = uVar17;
              *(U32 *)((long)pplVar38 + -4) = (U32)(XVar8 >> 0x20);
              *pplVar38 = local_178->hashTable +
                          ((ulong)uVar17 << ((byte)local_180->bucketSizeLog & 0x3f));
              uVar25 = uVar25 + 1;
              uVar7 = (ulong)local_1d4;
              pplVar38 = pplVar38 + 3;
              params = local_180;
              ldmState = local_178;
              puVar14 = local_1a8;
            } while (uVar25 < uVar7);
          }
          if ((int)uVar7 != 0) {
            local_88 = -local_150;
            uVar25 = 0;
            do {
              local_60 = uVar25;
              puVar18 = (ulong *)local_1b0[local_60].split;
              uVar26 = (ulong)local_1b0[local_60].checksum;
              uVar32 = (ulong)local_1b0[local_60].hash;
              uVar25 = (long)puVar18 - (long)local_170;
              if (puVar18 < puVar14) {
                bVar10 = (byte)params->bucketSizeLog;
                pBVar19 = ldmState->bucketOffsets;
                bVar11 = pBVar19[uVar32];
                ldmState->hashTable[(uVar32 << (bVar10 & 0x3f)) + (ulong)bVar11] =
                     (ldmEntry_t)(uVar25 & 0xffffffff | uVar26 << 0x20);
                pBVar19[uVar32] = ~(byte)(-1 << (bVar10 & 0x1f)) & bVar11 + 1;
                iVar16 = 9;
                bVar5 = false;
              }
              else {
                plVar20 = local_1b0[local_60].bucket;
                local_d8 = plVar20 + local_68;
                local_108 = puVar18 + 1;
                local_148 = (ulong *)((long)puVar18 + -1);
                local_f8 = 0;
                local_100 = (ulong *)0x0;
                uVar23 = 0;
                local_140 = (ldmEntry_t *)0x0;
                do {
                  if (plVar20->checksum == local_1b0[local_60].checksum) {
                    uVar13 = plVar20->offset;
                    if (local_18c < uVar13) {
                      if (local_190 < uVar12) {
                        puVar22 = local_58;
                        local_48 = local_170;
                        if (uVar13 < uVar12) {
                          puVar22 = local_138;
                          local_48 = local_50;
                        }
                        local_1c8 = (ulong *)(local_48 + uVar13);
                        puVar21 = (ulong *)(((long)puVar22 - (long)local_1c8) + (long)puVar18);
                        if (puVar30 <= puVar21) {
                          puVar21 = local_58;
                        }
                        puVar28 = local_1c8;
                        puVar27 = puVar18;
                        if (puVar18 < (ulong *)((long)puVar21 - 7U)) {
                          uVar9 = *puVar18 ^ *local_1c8;
                          uVar36 = 0;
                          if (uVar9 != 0) {
                            for (; (uVar9 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                            }
                          }
                          uVar36 = uVar36 >> 3 & 0x1fffffff;
                          puVar27 = local_108;
                          if (*local_1c8 == *puVar18) {
                            do {
                              puVar28 = puVar28 + 1;
                              if ((ulong *)((long)puVar21 - 7U) <= puVar27) goto LAB_0020607d;
                              uVar9 = *puVar27;
                              uVar15 = uVar9 ^ *puVar28;
                              uVar36 = 0;
                              if (uVar15 != 0) {
                                for (; (uVar15 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                                }
                              }
                              uVar36 = (long)puVar27 + ((uVar36 >> 3 & 0x1fffffff) - (long)puVar18);
                              puVar27 = puVar27 + 1;
                            } while (*puVar28 == uVar9);
                          }
                        }
                        else {
LAB_0020607d:
                          if ((puVar27 < (ulong *)((long)puVar21 - 3U)) &&
                             ((int)*puVar28 == (int)*puVar27)) {
                            puVar27 = (ulong *)((long)puVar27 + 4);
                            puVar28 = (ulong *)((long)puVar28 + 4);
                          }
                          if ((puVar27 < (ulong *)((long)puVar21 - 1U)) &&
                             ((short)*puVar28 == (short)*puVar27)) {
                            puVar27 = (ulong *)((long)puVar27 + 2);
                            puVar28 = (ulong *)((long)puVar28 + 2);
                          }
                          if (puVar27 < puVar21) {
                            puVar27 = (ulong *)((long)puVar27 +
                                               (ulong)((char)*puVar28 == (char)*puVar27));
                          }
                          uVar36 = (long)puVar27 - (long)puVar18;
                        }
                        if ((ulong *)((long)local_1c8 + uVar36) == puVar22) {
                          puVar22 = (ulong *)((long)puVar18 + uVar36);
                          puVar28 = local_168;
                          puVar21 = puVar22;
                          if (puVar22 < local_1c0) {
                            uVar15 = *puVar22 ^ *local_168;
                            uVar9 = 0;
                            if (uVar15 != 0) {
                              for (; (uVar15 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                              }
                            }
                            uVar9 = uVar9 >> 3 & 0x1fffffff;
                            puVar28 = local_80;
                            if (*local_168 == *puVar22) {
                              do {
                                puVar21 = puVar21 + 1;
                                if (local_1c0 <= puVar21) goto LAB_0020624c;
                                uVar15 = *puVar28;
                                uVar33 = *puVar21 ^ uVar15;
                                uVar9 = 0;
                                if (uVar33 != 0) {
                                  for (; (uVar33 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                                  }
                                }
                                uVar9 = (long)puVar21 + ((uVar9 >> 3 & 0x1fffffff) - (long)puVar22);
                                puVar28 = puVar28 + 1;
                              } while (uVar15 == *puVar21);
                            }
                          }
                          else {
LAB_0020624c:
                            if ((puVar21 < local_e8) && ((int)*puVar28 == (int)*puVar21)) {
                              puVar21 = (ulong *)((long)puVar21 + 4);
                              puVar28 = (ulong *)((long)puVar28 + 4);
                            }
                            if ((puVar21 < local_f0) && ((short)*puVar28 == (short)*puVar21)) {
                              puVar21 = (ulong *)((long)puVar21 + 2);
                              puVar28 = (ulong *)((long)puVar28 + 2);
                            }
                            if (puVar21 < puVar30) {
                              puVar21 = (ulong *)((long)puVar21 +
                                                 (ulong)((char)*puVar28 == (char)*puVar21));
                            }
                            uVar9 = (long)puVar21 - (long)puVar22;
                          }
                          uVar36 = uVar36 + uVar9;
                        }
                        params = local_180;
                        if (uVar34 <= uVar36) {
                          puVar22 = local_168;
                          if (uVar13 < uVar12) {
                            puVar22 = local_e0;
                          }
                          if (puVar14 < puVar18) {
                            puVar37 = (ulong *)0x0;
                            if (puVar22 < local_1c8) {
                              puVar21 = (ulong *)(local_48 + uVar13);
                              puVar37 = (ulong *)0x0;
                              puVar28 = local_148;
                              do {
                                puVar21 = (ulong *)((long)puVar21 + -1);
                                if (((char)*puVar28 != *(char *)puVar21) ||
                                   (puVar37 = (ulong *)((long)puVar37 + 1), puVar28 <= puVar14))
                                break;
                                puVar28 = (ulong *)((long)puVar28 + -1);
                              } while (puVar22 < puVar21);
                            }
                          }
                          else {
                            puVar37 = (ulong *)0x0;
                          }
                          if ((puVar22 != local_e0) &&
                             ((ulong *)((long)local_1c8 - (long)puVar37) == puVar22)) {
                            if (local_e0 < local_138) {
                              lVar35 = 0;
                              if (puVar14 < (ulong *)((long)puVar18 + -(long)puVar37)) {
                                puVar21 = (ulong *)(-(long)puVar37 + (long)local_148);
                                lVar35 = 0;
                                puVar22 = local_78;
                                do {
                                  if (((char)*puVar21 != (char)*puVar22) ||
                                     (lVar35 = lVar35 + 1, puVar21 <= puVar14)) break;
                                  puVar21 = (ulong *)((long)puVar21 + -1);
                                  bVar5 = local_e0 < puVar22;
                                  puVar22 = (ulong *)((long)puVar22 + -1);
                                } while (bVar5);
                              }
                            }
                            else {
                              lVar35 = 0;
                            }
                            puVar37 = (ulong *)((long)puVar37 + lVar35);
                          }
                        }
                      }
                      else {
                        puVar22 = (ulong *)(local_170 + uVar13);
                        puVar21 = puVar18;
                        if (puVar18 < local_1c0) {
                          uVar9 = *puVar18 ^ *puVar22;
                          uVar36 = 0;
                          if (uVar9 != 0) {
                            for (; (uVar9 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                            }
                          }
                          uVar36 = uVar36 >> 3 & 0x1fffffff;
                          puVar21 = local_108;
                          if (*puVar22 == *puVar18) {
                            do {
                              puVar22 = puVar22 + 1;
                              if (local_1c0 <= puVar21) goto LAB_002060f3;
                              uVar9 = *puVar21;
                              uVar15 = uVar9 ^ *puVar22;
                              uVar36 = 0;
                              if (uVar15 != 0) {
                                for (; (uVar15 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                                }
                              }
                              uVar36 = (long)puVar21 + ((uVar36 >> 3 & 0x1fffffff) - (long)puVar18);
                              puVar21 = puVar21 + 1;
                            } while (*puVar22 == uVar9);
                          }
                        }
                        else {
LAB_002060f3:
                          if ((puVar21 < local_e8) && ((int)*puVar22 == (int)*puVar21)) {
                            puVar21 = (ulong *)((long)puVar21 + 4);
                            puVar22 = (ulong *)((long)puVar22 + 4);
                          }
                          if ((puVar21 < local_f0) && ((short)*puVar22 == (short)*puVar21)) {
                            puVar21 = (ulong *)((long)puVar21 + 2);
                            puVar22 = (ulong *)((long)puVar22 + 2);
                          }
                          if (puVar21 < puVar30) {
                            puVar21 = (ulong *)((long)puVar21 +
                                               (ulong)((char)*puVar22 == (char)*puVar21));
                          }
                          uVar36 = (long)puVar21 - (long)puVar18;
                        }
                        if (uVar34 <= uVar36) {
                          if (puVar14 < puVar18) {
                            puVar37 = (ulong *)0x0;
                            if (uVar12 < uVar13) {
                              puVar37 = (ulong *)0x0;
                              puVar22 = local_148;
                              puVar21 = (ulong *)(local_70 + uVar13);
                              do {
                                if (((char)*puVar22 != (char)*puVar21) ||
                                   (puVar37 = (ulong *)((long)puVar37 + 1), puVar22 <= puVar14))
                                break;
                                puVar22 = (ulong *)((long)puVar22 + -1);
                                bVar5 = local_168 < puVar21;
                                puVar21 = (ulong *)((long)puVar21 + -1);
                              } while (bVar5);
                            }
                          }
                          else {
                            puVar37 = (ulong *)0x0;
                          }
                        }
                      }
                      if ((uVar34 <= uVar36) && (uVar23 < uVar36 + (long)puVar37)) {
                        uVar23 = uVar36 + (long)puVar37;
                        local_140 = plVar20;
                        local_100 = puVar37;
                        local_f8 = uVar36;
                      }
                    }
                  }
                  plVar20 = plVar20 + 1;
                } while (plVar20 < local_d8);
                ldmState = local_178;
                local_1d0 = uVar25;
                local_1a8 = puVar14;
                local_1a0 = uVar26;
                local_198 = uVar32;
                if (local_140 == (ldmEntry_t *)0x0) {
                  bVar10 = (byte)params->bucketSizeLog;
                  pBVar19 = local_178->bucketOffsets;
                  bVar11 = pBVar19[uVar32];
                  local_178->hashTable[(uVar32 << (bVar10 & 0x3f)) + (ulong)bVar11] =
                       (ldmEntry_t)(uVar25 & 0xffffffff | uVar26 << 0x20);
                  pBVar19[uVar32] = ~(byte)(-1 << (bVar10 & 0x1f)) & bVar11 + 1;
                  iVar16 = 9;
                }
                else {
                  sVar3 = local_158->size;
                  iVar16 = 0;
                  if (sVar3 != local_158->capacity) {
                    prVar4 = local_158->seq;
                    UVar6 = local_140->offset;
                    prVar4[sVar3].litLength = ((int)puVar18 - (int)local_100) - (int)puVar14;
                    prVar4[sVar3].matchLength = (int)local_f8 + (int)local_100;
                    prVar4[sVar3].offset = (int)uVar25 - UVar6;
                    local_158->size = sVar3 + 1;
                    bVar10 = (byte)local_180->bucketSizeLog;
                    pBVar19 = local_178->bucketOffsets;
                    bVar11 = pBVar19[uVar32];
                    local_178->hashTable[(uVar32 << (bVar10 & 0x3f)) + (ulong)bVar11] =
                         (ldmEntry_t)(uVar25 & 0xffffffff | uVar26 << 0x20);
                    pBVar19[uVar32] = ~(byte)(-1 << (bVar10 & 0x1f)) & bVar11 + 1;
                    puVar14 = (ulong *)((long)puVar18 + local_f8);
                    puVar18 = (ulong *)(local_1b8 + local_150);
                    if (puVar18 < puVar14) {
                      local_1b8 = (BYTE *)(local_88 + (long)puVar14);
                      iVar16 = 7;
                    }
                    bVar5 = puVar18 >= puVar14;
                    params = local_180;
                    goto LAB_0020654b;
                  }
                  iVar16 = 1;
                }
                bVar5 = false;
              }
LAB_0020654b:
              local_188 = uVar7;
              if ((iVar16 != 0) && (iVar16 != 9)) {
                data = local_1b8;
                if (iVar16 != 7) goto LAB_0020657e;
                break;
              }
              uVar25 = local_60 + 1;
            } while (local_60 + 1 != uVar7);
          }
          bVar5 = true;
          data = local_1b8 + local_150;
LAB_0020657e:
        } while (bVar5);
        uVar25 = 0xffffffffffffffba;
        sequences = local_158;
        srcSize = local_118;
        lVar35 = local_128;
        uVar7 = local_120;
      }
LAB_002065cb:
      uVar34 = uVar25;
      if (uVar25 < 0xffffffffffffff89) {
        uVar34 = local_d0;
        if (local_b8 < sequences->size) {
          pUVar2 = &sequences->seq[local_b8].litLength;
          *pUVar2 = *pUVar2 + (int)local_160;
          local_160 = uVar25;
        }
        else {
          if (uVar25 != local_110) {
            __assert_fail("newLeftoverSize == chunkSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                          ,0x23f,
                          "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                         );
          }
          local_160 = local_160 + local_110;
        }
      }
      local_d0 = uVar34;
      if (0xffffffffffffff88 < uVar25) {
        return local_d0;
      }
      local_b0 = local_b0 + 1;
    } while (local_b0 != lVar35);
  }
  return 0;
}

Assistant:

size_t ZSTD_ldm_generateSequences(
        ldmState_t* ldmState, rawSeqStore_t* sequences,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    U32 const maxDist = 1U << params->windowLog;
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    size_t const kMaxChunkSize = 1 << 20;
    size_t const nbChunks = (srcSize / kMaxChunkSize) + ((srcSize % kMaxChunkSize) != 0);
    size_t chunk;
    size_t leftoverSize = 0;

    assert(ZSTD_CHUNKSIZE_MAX >= kMaxChunkSize);
    /* Check that ZSTD_window_update() has been called for this chunk prior
     * to passing it to this function.
     */
    assert(ldmState->window.nextSrc >= (BYTE const*)src + srcSize);
    /* The input could be very large (in zstdmt), so it must be broken up into
     * chunks to enforce the maximum distance and handle overflow correction.
     */
    assert(sequences->pos <= sequences->size);
    assert(sequences->size <= sequences->capacity);
    for (chunk = 0; chunk < nbChunks && sequences->size < sequences->capacity; ++chunk) {
        BYTE const* const chunkStart = istart + chunk * kMaxChunkSize;
        size_t const remaining = (size_t)(iend - chunkStart);
        BYTE const *const chunkEnd =
            (remaining < kMaxChunkSize) ? iend : chunkStart + kMaxChunkSize;
        size_t const chunkSize = chunkEnd - chunkStart;
        size_t newLeftoverSize;
        size_t const prevSize = sequences->size;

        assert(chunkStart < iend);
        /* 1. Perform overflow correction if necessary. */
        if (ZSTD_window_needOverflowCorrection(ldmState->window, 0, maxDist, ldmState->loadedDictEnd, chunkStart, chunkEnd)) {
            U32 const ldmHSize = 1U << params->hashLog;
            U32 const correction = ZSTD_window_correctOverflow(
                &ldmState->window, /* cycleLog */ 0, maxDist, chunkStart);
            ZSTD_ldm_reduceTable(ldmState->hashTable, ldmHSize, correction);
            /* invalidate dictionaries on overflow correction */
            ldmState->loadedDictEnd = 0;
        }
        /* 2. We enforce the maximum offset allowed.
         *
         * kMaxChunkSize should be small enough that we don't lose too much of
         * the window through early invalidation.
         * TODO: * Test the chunk size.
         *       * Try invalidation after the sequence generation and test the
         *         offset against maxDist directly.
         *
         * NOTE: Because of dictionaries + sequence splitting we MUST make sure
         * that any offset used is valid at the END of the sequence, since it may
         * be split into two sequences. This condition holds when using
         * ZSTD_window_enforceMaxDist(), but if we move to checking offsets
         * against maxDist directly, we'll have to carefully handle that case.
         */
        ZSTD_window_enforceMaxDist(&ldmState->window, chunkEnd, maxDist, &ldmState->loadedDictEnd, NULL);
        /* 3. Generate the sequences for the chunk, and get newLeftoverSize. */
        newLeftoverSize = ZSTD_ldm_generateSequences_internal(
            ldmState, sequences, params, chunkStart, chunkSize);
        if (ZSTD_isError(newLeftoverSize))
            return newLeftoverSize;
        /* 4. We add the leftover literals from previous iterations to the first
         *    newly generated sequence, or add the `newLeftoverSize` if none are
         *    generated.
         */
        /* Prepend the leftover literals from the last call */
        if (prevSize < sequences->size) {
            sequences->seq[prevSize].litLength += (U32)leftoverSize;
            leftoverSize = newLeftoverSize;
        } else {
            assert(newLeftoverSize == chunkSize);
            leftoverSize += chunkSize;
        }
    }
    return 0;
}